

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void makeniche(level *lev,int trap_type)

{
  rm (*parVar1) [21];
  char cVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  trap *ptVar6;
  permonst *ptr;
  int iVar7;
  xchar y;
  long lVar8;
  uint y_00;
  undefined4 in_register_00000034;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  mkroom *aroom;
  coord dd;
  coord local_4a;
  ulong local_48;
  rm (*local_40) [21];
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000034,trap_type);
  if (lev->doorindex < 0x78) {
    local_40 = lev->locations;
    iVar10 = -8;
    do {
      iVar7 = lev->nroom;
      uVar4 = mt_random();
      lVar8 = SUB168(ZEXT416(uVar4) % SEXT816((long)iVar7),0);
      if ((lev->rooms[lVar8].rtype == '\0') &&
         ((aroom = lev->rooms + lVar8, aroom->doorct != '\x01' ||
          (uVar4 = mt_random(), uVar4 * -0x33333333 < 0x33333334)))) {
        uVar4 = mt_random();
        if ((uVar4 & 1) == 0) {
          cVar2 = aroom->ly + -1;
          finddpos(lev,&local_4a,aroom->lx,cVar2,aroom->hx,cVar2);
          iVar7 = -1;
        }
        else {
          cVar2 = aroom->hy + '\x01';
          finddpos(lev,&local_4a,aroom->lx,cVar2,aroom->hx,cVar2);
          iVar7 = 1;
        }
        uVar11 = local_38;
        parVar1 = local_40;
        uVar4 = (uint)local_4a.x;
        if (uVar4 - 1 < 0x4f) {
          uVar9 = (uint)local_4a.y;
          local_48 = (ulong)uVar9;
          y_00 = iVar7 + uVar9;
          if ((((y_00 < 0x15) && (local_40[uVar4][y_00].typ == '\0')) &&
              (uVar9 = uVar9 - iVar7, uVar9 < 0x15)) &&
             ((cVar2 = local_40[uVar4][uVar9].typ, 3 < (byte)(cVar2 - 0x11U) &&
              (7 < (byte)(cVar2 - 0x1aU))))) {
            if ((int)local_38 == 0) {
              uVar9 = mt_random();
              if ((uVar9 & 3) != 0) {
                parVar1[(int)uVar4][y_00].typ = '\x18';
                uVar9 = mt_random();
                uVar5 = mt_random();
                if (uVar9 * -0x49249249 < 0x24924925) {
                  if ((uVar5 & 7) == 0) {
                    cVar2 = parVar1[(int)uVar4][(int)local_48].typ;
                    if (cVar2 < '\r' && cVar2 != '\0') {
                      parVar1[(int)uVar4][(int)local_48].typ = '\x16';
                      uVar9 = mt_random();
                      if (0x55555555 < uVar9 * -0x55555555) {
                        ptr = mkclass(&lev->z,'5',0);
                        mkcorpstat(0x10e,(monst *)0x0,ptr,lev,uVar4,y_00,'\x01');
                      }
                    }
                  }
                  if (((lev->flags).field_0x9 & 8) == 0) {
                    mksobj_at(0x15c,lev,uVar4,y_00,'\x01','\0');
                  }
                  uVar9 = mt_random();
                  if (0x55555555 < uVar9 * -0x55555555) {
                    return;
                  }
                  mkobj_at('\0',lev,uVar4,y_00,'\x01');
                  return;
                }
                iVar10 = (uint)(uVar5 * -0x33333333 < 0x33333334) * 8 + 0xf;
                y = (xchar)local_48;
                goto LAB_001dbb96;
              }
              parVar1[(int)uVar4][y_00].typ = '\x10';
            }
            else {
              local_40[(int)uVar4][y_00].typ = '\x10';
              if ((int)local_38 - 0xdU < 2) {
                bVar3 = can_fall_thru(lev);
                uVar11 = uVar11 & 0xffffffff;
                if (bVar3 == '\0') {
                  uVar11 = 3;
                }
              }
              ptVar6 = maketrap(lev,uVar4,y_00,(int)uVar11);
              if (ptVar6 != (trap *)0x0) {
                if ((int)uVar11 != 3) {
                  ptVar6->field_0x8 = ptVar6->field_0x8 | 0x40;
                }
                if ((0x1fcbfffUL >> (uVar11 & 0x3f) & 1) == 0) {
                  make_engr_at(lev,uVar4,uVar9,trap_engravings[uVar11 & 0xffffffff],0,'\x01');
                  wipe_engr_at(lev,local_4a.x,(xchar)uVar9,'\x05');
                }
              }
            }
            y = (xchar)local_48;
            iVar10 = 0xf;
LAB_001dbb96:
            dosdoor(lev,local_4a.x,y,aroom,iVar10);
            return;
          }
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

static void makeniche(struct level *lev, int trap_type)
{
	struct mkroom *aroom;
	struct rm *rm;
	int vct = 8;
	int dy, xx, yy;
	struct trap *ttmp;

	if (lev->doorindex < DOORMAX)
	  while (vct--) {
	    aroom = &lev->rooms[rn2(lev->nroom)];
	    if (aroom->rtype != OROOM) continue;	/* not an ordinary room */
	    if (aroom->doorct == 1 && rn2(5)) continue;
	    if (!place_niche(lev, aroom, &dy, &xx, &yy)) continue;

	    rm = &lev->locations[xx][yy+dy];
	    if (trap_type || !rn2(4)) {

		rm->typ = SCORR;
		if (trap_type) {
		    if ((trap_type == HOLE || trap_type == TRAPDOOR)
			&& !can_fall_thru(lev))
			trap_type = ROCKTRAP;
		    ttmp = maketrap(lev, xx, yy+dy, trap_type);
		    if (ttmp) {
			if (trap_type != ROCKTRAP) ttmp->once = 1;
			if (trap_engravings[trap_type]) {
			    make_engr_at(lev, xx, yy-dy,
				     trap_engravings[trap_type], 0L, DUST);
			    wipe_engr_at(lev, xx, yy-dy, 5); /* age it a little */
			}
		    }
		}
		dosdoor(lev, xx, yy, aroom, SDOOR);
	    } else {
		rm->typ = CORR;
		if (rn2(7)) {
		    dosdoor(lev, xx, yy, aroom, rn2(5) ? SDOOR : DOOR);
		} else {
		    /* inaccessible niches occasionally have iron bars */
		    if (!rn2(8) && IS_WALL(lev->locations[xx][yy].typ)) {
			lev->locations[xx][yy].typ = IRONBARS;
			if (rn2(3)) {
			    mkcorpstat(CORPSE, NULL, mkclass(&lev->z, S_HUMAN, 0),
				       lev, xx, yy + dy, TRUE);
			}
		    }
		    if (!lev->flags.noteleport)
			mksobj_at(SCR_TELEPORTATION, lev,
					 xx, yy+dy, TRUE, FALSE);
		    if (!rn2(3)) mkobj_at(0, lev, xx, yy+dy, TRUE);
		}
	    }
	    return;
	}
}